

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectSeqTest(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  Vec_Int_t *pVStack_18;
  int i;
  Vec_Int_t *vObjs;
  Gia_Man_t *p_local;
  
  vObjs = (Vec_Int_t *)p;
  aVar3 = Abc_Clock();
  clk._4_4_ = 0;
  while( true ) {
    uVar1 = clk._4_4_;
    iVar2 = Gia_ManPoNum((Gia_Man_t *)vObjs);
    if (iVar2 <= (int)uVar1) break;
    if ((int)clk._4_4_ % 10000 == 0) {
      printf("%8d finished...\r",(ulong)clk._4_4_);
    }
    pVStack_18 = Gia_ManCollectSeq((Gia_Man_t *)vObjs,(int *)((long)&clk + 4),1);
    Vec_IntFree(pVStack_18);
    clk._4_4_ = clk._4_4_ + 1;
  }
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return;
}

Assistant:

void Gia_ManCollectSeqTest( Gia_Man_t * p )
{
    Vec_Int_t * vObjs;
    int i;
    abctime clk = Abc_Clock();
    for ( i = 0; i < Gia_ManPoNum(p); i++ )
    {
        if ( i % 10000 == 0 )
            printf( "%8d finished...\r", i );

        vObjs = Gia_ManCollectSeq( p, &i, 1 );
//        printf( "%d ", Vec_IntSize(vObjs) );
        Vec_IntFree( vObjs );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}